

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O3

bool __thiscall
AsyncRgbLedAnalyzer::DetectSpeedMode
          (AsyncRgbLedAnalyzer *this,double positiveTimeSec,double negativeTimeSec,BitState *value)

{
  bool bVar1;
  ostream *poVar2;
  BitState value_00;
  long lVar3;
  BitState local_68 [2];
  BitTiming local_60;
  
  this->mDidDetectHighSpeed = false;
  local_68[0] = BIT_LOW;
  local_68[1] = BIT_HIGH;
  lVar3 = 0;
  do {
    value_00 = *(BitState *)((long)local_68 + lVar3);
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_60,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,value_00,
               false);
    bVar1 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
    if (bVar1) goto LAB_001076f5;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 8);
  bVar1 = AsyncRgbLedAnalyzerSettings::IsHighSpeedSupported
                    ((this->mSettings)._M_t.
                     super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                     .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
  if (bVar1) {
    local_68[0] = BIT_LOW;
    local_68[1] = BIT_HIGH;
    lVar3 = 0;
    do {
      value_00 = *(BitState *)((long)local_68 + lVar3);
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,value_00,
                 true);
      bVar1 = BitTiming::WithinTolerance(&local_60,positiveTimeSec,negativeTimeSec);
      if (bVar1) {
        this->mDidDetectHighSpeed = true;
LAB_001076f5:
        *value = value_00;
        this->mFirstBitAfterReset = false;
        return true;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"failed to classify: ",0x14);
  poVar2 = std::ostream::_M_insert<double>(positiveTimeSec);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"/",1);
  poVar2 = std::ostream::_M_insert<double>(negativeTimeSec);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return false;
}

Assistant:

bool AsyncRgbLedAnalyzer::DetectSpeedMode( double positiveTimeSec, double negativeTimeSec, BitState& value )
{
    mDidDetectHighSpeed = false;

    // low speed bits
    for( const auto b : { BIT_LOW, BIT_HIGH } )
    {
        if( mSettings->DataTiming( b ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
        {
            value = b;
            mFirstBitAfterReset = false;
            return true;
        }
    }

    if( mSettings->IsHighSpeedSupported() )
    {
        // high speed bits
        for( const auto b : { BIT_LOW, BIT_HIGH } )
        {
            if( mSettings->DataTiming( b, true ).WithinTolerance( positiveTimeSec, negativeTimeSec ) )
            {
                mDidDetectHighSpeed = true;
                value = b;
                mFirstBitAfterReset = false;
                return true;
            }
        }
    } // of high-speed mode tests

    std::cerr << "failed to classify: " << positiveTimeSec << "/" << negativeTimeSec << std::endl;
    return false;
}